

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int init_path(void)

{
  char cVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  uint l;
  
  __s = getenv(machine->include_env);
  if (__s == (char *)0x0) {
    iVar4 = 2;
  }
  else {
    do {
      pcVar2 = strchr(__s,0x3a);
      if (pcVar2 == (char *)0x0) {
        sVar3 = strlen(__s);
        iVar4 = (int)sVar3;
      }
      else {
        iVar4 = (int)pcVar2 - (int)__s;
      }
      l = iVar4 + 1;
      if ((int)l < 2) {
        __s = __s + 1;
      }
      else {
        iVar4 = add_path(__s,l);
        if (iVar4 == 0) {
          return 0;
        }
        do {
          cVar1 = *__s;
          __s = __s + 1;
        } while (cVar1 == ':');
        __s = __s + ((ulong)l - 1);
      }
    } while (pcVar2 != (char *)0x0);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
init_path(void)
{
	char *p,*pl;
	int	ret, l;

	/* Get env variable holding PCE path*/
	p = getenv(machine->include_env);

	if (p == NULL)
		return 2;

	l  = 0;
	pl = p;
	while(pl != NULL)
	{
		
		/* Jump to next separator */
		pl = strchr(p, ENV_PATH_SEPARATOR);

		/* Compute new substring size */
		if(pl == NULL)
			l = strlen(p) + 1;
		else
			l = pl - p + 1;
			
		/* Might be empty, jump to next char */
		if(l <= 1)
		{
			++p;
			continue;
		}

		/* Add path */
		ret = add_path(p, l);
		if(!ret)
			return 0;

		/* Eat remaining separators */
		while (*p == ENV_PATH_SEPARATOR) ++p;
		
		p += l;
	}
	
	return 1;
}